

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_224a1::
ARTIteratorTest_I4AndTwoLeavesReverseScan_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_I4AndTwoLeavesReverseScan_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  char *expected_predicate_value;
  pointer *__ptr;
  key_view kVar4;
  value_view v;
  value_view v_00;
  iterator b;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  AssertHelper local_6b0;
  AssertHelper local_6a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_698;
  undefined1 local_690 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_680;
  iterator local_670;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_500,false);
  kVar4 = unodb::test::
          tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key(&local_500,0);
  v._M_extent._M_extent_value = 1;
  v._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal(&local_500,kVar4,v,false);
  kVar4 = unodb::test::
          tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key(&local_500,1);
  expected_predicate_value = (char *)0x0;
  v_00._M_extent._M_extent_value = 2;
  v_00._M_ptr = &unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal(&local_500,kVar4,v_00,false);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator(&local_670,&local_500.test_db);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::last(&local_670);
  local_6a0._M_head_impl._0_1_ =
       (internal)
       (local_670.stack_.c.
        super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
       local_670.stack_.c.
       super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur);
  local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_670.stack_.c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_670.stack_.c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    testing::Message::Message((Message *)&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_690,(internal *)&local_6a0,(AssertionResult *)"b.valid()","false",
               "true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x71,(char *)CONCAT71(local_690._1_7_,local_690[0]));
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_690._1_7_,local_690[0]) != &local_680) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_690._1_7_,local_690[0]),local_680._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) + 8))();
    }
    if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_698,local_698);
    }
  }
  kVar4 = unodb::
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key(&local_670);
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_6a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  local_6b0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_690,"(decode(b.get_key()))","(1)",(unsigned_long *)&local_6a0,
             (int *)&local_6b0);
  if (local_690[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_6a0);
    if (local_688 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_688->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6b0,(Message *)&local_6a0);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    if (local_6a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6a0._M_head_impl + 8))();
    }
  }
  if (local_688 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_688,local_688);
  }
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::get_val((iterator *)local_690);
  bVar2 = std::ranges::__equal_fn::
          operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,(iterator *)local_690,0x251168);
  local_6a0._M_head_impl._0_1_ = (internal)bVar2;
  local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  unodb::detail::qsbr_ptr_base::unregister_active_ptr
            ((void *)CONCAT71(local_690._1_7_,local_690[0]));
  if (local_6a0._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_690,(internal *)&local_6a0,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[1])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x75,(char *)CONCAT71(local_690._1_7_,local_690[0]));
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_690._1_7_,local_690[0]) != &local_680) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_690._1_7_,local_690[0]),local_680._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) + 8))();
    }
  }
  if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_698,local_698);
  }
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::prior(&local_670);
  local_6a0._M_head_impl._0_1_ =
       (internal)
       (local_670.stack_.c.
        super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
       local_670.stack_.c.
       super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur);
  local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_670.stack_.c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_670.stack_.c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    testing::Message::Message((Message *)&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_690,(internal *)&local_6a0,(AssertionResult *)"b.valid()","false",
               "true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x78,(char *)CONCAT71(local_690._1_7_,local_690[0]));
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_690._1_7_,local_690[0]) != &local_680) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_690._1_7_,local_690[0]),local_680._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) + 8))();
    }
    if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_698,local_698);
    }
  }
  kVar4 = unodb::
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key(&local_670);
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_6a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  local_6b0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_690,"(decode(b.get_key()))","(0)",(unsigned_long *)&local_6a0,
             (int *)&local_6b0);
  if (local_690[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_6a0);
    if (local_688 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_688->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6b0,(Message *)&local_6a0);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    if (local_6a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6a0._M_head_impl + 8))();
    }
  }
  if (local_688 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_688,local_688);
  }
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::get_val((iterator *)local_690);
  bVar2 = std::ranges::__equal_fn::
          operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,(iterator *)local_690,
                     unodb::test::test_values);
  local_6a0._M_head_impl._0_1_ = (internal)bVar2;
  local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  unodb::detail::qsbr_ptr_base::unregister_active_ptr
            ((void *)CONCAT71(local_690._1_7_,local_690[0]));
  if (local_6a0._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_690,(internal *)&local_6a0,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[0])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7c,(char *)CONCAT71(local_690._1_7_,local_690[0]));
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_690._1_7_,local_690[0]) != &local_680) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_690._1_7_,local_690[0]),local_680._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) + 8))();
    }
  }
  if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_698,local_698);
  }
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::prior(&local_670);
  local_6a0._M_head_impl._0_1_ =
       (internal)
       (local_670.stack_.c.
        super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
       local_670.stack_.c.
       super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur);
  local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_670.stack_.c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_670.stack_.c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    testing::Message::Message((Message *)&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_690,(internal *)&local_6a0,(AssertionResult *)"b.valid()","true",
               "false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7f,(char *)CONCAT71(local_690._1_7_,local_690[0]));
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_690._1_7_,local_690[0]) != &local_680) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_690._1_7_,local_690[0]),local_680._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) + 8))();
    }
    if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_698,local_698);
    }
  }
  if (0x100 < local_670.keybuf_.cap) {
    free(local_670.keybuf_.buf);
  }
  std::
  _Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
  ::~_Deque_base((_Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                  *)&local_670.stack_);
  if (local_500.key_views.
      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_500.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree(&local_500.values._M_t);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::~olc_db(&local_500.test_db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, I4AndTwoLeavesReverseScan) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  verifier.insert(1, unodb::test::test_values[1]);
  auto b = db.test_only_iterator();
  b.last();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[1]));
  }
  b.prior();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[0]));
  }
  b.prior();
  UNODB_EXPECT_FALSE(b.valid());  // nothing more in the iterator.
}